

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_grid.c
# Opt level: O1

REF_STATUS ref_grid_cell_with(REF_GRID ref_grid,REF_INT node_per,REF_CELL *ref_cell)

{
  REF_CELL pRVar1;
  
  *ref_cell = (REF_CELL)0x0;
  switch(node_per) {
  case 4:
    pRVar1 = ref_grid->cell[8];
    break;
  case 5:
    pRVar1 = ref_grid->cell[9];
    break;
  case 6:
    pRVar1 = ref_grid->cell[10];
    break;
  default:
    printf("node_per %d\n");
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",299,
           "ref_grid_cell_with",1,"unexpected node_per");
    return 1;
  case 8:
    pRVar1 = ref_grid->cell[0xb];
  }
  *ref_cell = pRVar1;
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_grid_cell_with(REF_GRID ref_grid, REF_INT node_per,
                                      REF_CELL *ref_cell) {
  *ref_cell = NULL;

  switch (node_per) {
    case 4:
      *ref_cell = ref_grid_tet(ref_grid);
      break;
    case 5:
      *ref_cell = ref_grid_pyr(ref_grid);
      break;
    case 6:
      *ref_cell = ref_grid_pri(ref_grid);
      break;
    case 8:
      *ref_cell = ref_grid_hex(ref_grid);
      break;
    default:
      printf("node_per %d\n", node_per);
      RSS(REF_FAILURE, "unexpected node_per");
      break;
  }

  return REF_SUCCESS;
}